

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_headers.h
# Opt level: O0

void __thiscall
cppcms::impl::response_headers::
format_cgi_headers<cppcms::impl::response_headers::string_buffer_wrapper>
          (response_headers *this,string_buffer_wrapper *io,bool complete)

{
  bool bVar1;
  byte in_DL;
  string_buffer_wrapper *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *h;
  const_iterator __end3;
  const_iterator __begin3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  const_iterator e;
  const_iterator p;
  string *in_stack_ffffffffffffff98;
  string_buffer_wrapper *in_stack_ffffffffffffffa0;
  _Self local_40;
  _Self local_38;
  long local_30;
  _Self local_28;
  _Self local_20;
  byte local_11;
  string_buffer_wrapper *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_20._M_node =
       (_Base_ptr)
       std::
       begin<std::map<std::__cxx11::string,std::__cxx11::string,cppcms::impl::icompare_type,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                 ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffff98);
  local_28._M_node =
       (_Base_ptr)
       std::
       end<std::map<std::__cxx11::string,std::__cxx11::string,cppcms::impl::icompare_type,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                 ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::impl::icompare_type,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    in_stack_ffffffffffffffa0 = local_10;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x380af2);
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x380b1d);
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffffa0);
  }
  local_30 = in_RDI + 0x30;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff98);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_ffffffffffffffa0);
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  }
  if ((local_11 & 1) != 0) {
    string_buffer_wrapper::operator<<(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void format_cgi_headers(IODevice &io,bool complete) const
	{
		for(auto p=std::begin(headers_),e=std::end(headers_);p!=e;++p) {
			io << p->first << ": " << p->second << "\r\n";
		}
		for(auto const &h: added_headers_) {
			io <<  h << "\r\n" ;
		}
		if(complete)
			io << "\r\n";
	}